

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::setListViewText(QInputDialogPrivate *this,QString *text)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  QItemSelectionModel *pQVar3;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QComboBox::findText(this->comboBox,text,(MatchFlags)0x10);
  if (iVar1 != -1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = QComboBox::model(this->comboBox);
    (**(code **)(*(long *)pQVar2 + 0x60))(&local_38,pQVar2,iVar1,0);
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this->listView);
    (**(code **)(*(long *)pQVar3 + 0x60))(pQVar3,&local_38,0x13);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::setListViewText(const QString &text)
{
    int row = comboBox->findText(text);
    if (row != -1) {
        QModelIndex index(comboBox->model()->index(row, 0));
        listView->selectionModel()->setCurrentIndex(index, QItemSelectionModel::Clear
                                                         | QItemSelectionModel::SelectCurrent);
    }
}